

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> * __thiscall
helics::apps::Connector::buildPossibleConnectionList
          (Connector *this,string_view startingInterface,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *tagList)

{
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last1;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last1_00;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last1_01;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  string_view testString;
  ulong uVar1;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
  *p_Var2;
  bool bVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  element_type *peVar7;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>,_bool>
  pVar8;
  pair<std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>_>
  pVar9;
  Connection connection;
  string mstring;
  shared_ptr<helics::apps::RegexMatcher> *rmatcher;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
  *__range4;
  type match_1;
  size_t cascadeIndex;
  type match;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  searched;
  type *last;
  type *first;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *matches;
  value_type *in_stack_fffffffffffffc68;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffc70;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffc78;
  undefined7 in_stack_fffffffffffffc80;
  byte in_stack_fffffffffffffc87;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffc88;
  reference in_stack_fffffffffffffc90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc98;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffca0;
  byte local_351;
  undefined7 in_stack_fffffffffffffd08;
  byte in_stack_fffffffffffffd0f;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd10;
  RegexMatcher *in_stack_fffffffffffffd68;
  char *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  __normal_iterator<const_std::shared_ptr<helics::apps::RegexMatcher>_*,_std::vector<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>_>
  local_1c8;
  long local_1c0;
  _Self local_1b8;
  _Self local_1b0;
  size_t local_1a8;
  char *local_1a0;
  size_t local_198;
  char *local_190;
  unsigned_long *local_188;
  unsigned_long *local_180;
  unsigned_long *local_178;
  unsigned_long *local_170;
  unsigned_long *local_168;
  unsigned_long *local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  pair<std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>_>
  local_138;
  _Base_ptr local_128;
  undefined1 local_120;
  _Self local_118;
  _Self local_110;
  ulong local_108;
  undefined8 local_100;
  undefined8 local_f8;
  size_t local_f0;
  char *local_e8;
  unsigned_long *local_e0;
  unsigned_long *local_d8;
  unsigned_long *local_d0;
  unsigned_long *local_c8;
  unsigned_long *local_c0;
  unsigned_long *local_b8;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
  local_b0;
  _Base_ptr local_a8;
  undefined1 local_a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98 [2];
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
  local_68;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
  *local_60;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
  *local_58;
  pair<std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>_>
  local_40;
  undefined1 local_29;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_29 = 0;
  local_18 = in_RDX;
  uStack_10 = in_RCX;
  CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::vector
            ((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *)0x1f01bf
            );
  local_40 = CLI::std::
             unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
             ::equal_range((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
                            *)in_stack_fffffffffffffc70._M_current,
                           &in_stack_fffffffffffffc68->interface1);
  local_58 = &std::
              get<0ul,std::__detail::_Node_const_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>,false,true>,std::__detail::_Node_const_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>,false,true>>
                        ((pair<std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>_>
                          *)0x1f021a)->
              super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
  ;
  local_60 = &std::
              get<1ul,std::__detail::_Node_const_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>,false,true>,std::__detail::_Node_const_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>,false,true>>
                        ((pair<std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>_>
                          *)0x1f022f)->
              super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
  ;
  p_Var2 = local_58;
  local_68._M_cur =
       (__node_type *)
       CLI::std::
       unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
       ::end((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
              *)in_stack_fffffffffffffc68);
  bVar3 = CLI::std::__detail::operator==(p_Var2,&local_68);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    in_stack_fffffffffffffd10 = local_98;
    CLI::std::
    set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::set((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           *)0x1f0298);
    pVar8 = CLI::std::
            set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::insert((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)in_stack_fffffffffffffc90,(value_type *)in_stack_fffffffffffffc88._M_current
                    );
    local_a8 = (_Base_ptr)pVar8.first._M_node;
    local_a0 = pVar8.second;
    local_b0._M_cur = local_58->_M_cur;
    while( true ) {
      bVar3 = CLI::std::__detail::operator==(&local_b0,local_60);
      if (((bVar3 ^ 0xffU) & 1) == 0) break;
      CLI::std::__detail::
      _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>
      ::operator->((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>
                    *)0x1f031c);
      bVar3 = CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
      in_stack_fffffffffffffd0f = 1;
      if (!bVar3) {
        local_c0 = (unsigned_long *)
                   CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              in_stack_fffffffffffffc68);
        local_c8 = (unsigned_long *)
                   CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              in_stack_fffffffffffffc68);
        CLI::std::__detail::
        _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>
        ::operator->((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>
                      *)0x1f037f);
        local_d0 = (unsigned_long *)
                   CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              in_stack_fffffffffffffc68);
        CLI::std::__detail::
        _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>
        ::operator->((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>
                      *)0x1f03a0);
        local_d8 = (unsigned_long *)
                   CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              in_stack_fffffffffffffc68);
        __last1._M_current._7_1_ = in_stack_fffffffffffffc87;
        __last1._M_current._0_7_ = in_stack_fffffffffffffc80;
        local_b8 = (unsigned_long *)
                   std::
                   find_first_of<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                             (in_stack_fffffffffffffc88,__last1,in_stack_fffffffffffffc78,
                              in_stack_fffffffffffffc70._M_current);
        local_e0 = (unsigned_long *)
                   CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              in_stack_fffffffffffffc68);
        bVar3 = __gnu_cxx::
                operator==<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffffc70._M_current,
                           (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffffc68);
        in_stack_fffffffffffffd0f = bVar3 ^ 0xff;
      }
      if ((in_stack_fffffffffffffd0f & 1) != 0) {
        CLI::std::__detail::
        _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>
        ::operator->((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>
                      *)0x1f0443);
        std::vector<helics::apps::Connection,std::allocator<helics::apps::Connection>>::
        emplace_back<helics::apps::Connection_const&>
                  ((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *)
                   CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                   (Connection *)in_stack_fffffffffffffc78._M_current);
        pvVar6 = CLI::std::
                 vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::back
                           ((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                             *)in_stack_fffffffffffffc70._M_current);
        local_f0 = (pvVar6->interface1)._M_len;
        local_e8 = (pvVar6->interface1)._M_str;
        local_100 = local_18;
        local_f8 = uStack_10;
        __x._M_str = (char *)in_stack_fffffffffffffca0._M_current;
        __x._M_len = (size_t)in_stack_fffffffffffffc98;
        __y._M_str = (char *)in_stack_fffffffffffffc90;
        __y._M_len = (size_t)in_stack_fffffffffffffc88._M_current;
        bVar3 = std::operator==(__x,__y);
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          pvVar6 = CLI::std::
                   vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::back
                             ((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                               *)in_stack_fffffffffffffc70._M_current);
          pvVar4 = CLI::std::
                   vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::back
                             ((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                               *)in_stack_fffffffffffffc70._M_current);
          std::swap<std::basic_string_view<char,std::char_traits<char>>>
                    (&pvVar6->interface1,&pvVar4->interface2);
        }
      }
      CLI::std::__detail::
      _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>
      ::operator++((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>
                    *)in_stack_fffffffffffffc70._M_current);
    }
    local_108 = 0;
    while( true ) {
      uVar1 = local_108;
      sVar5 = CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
              ::size(in_RDI);
      if (sVar5 <= uVar1) break;
      CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
      operator[](in_RDI,local_108);
      local_110._M_node =
           (_Base_ptr)
           CLI::std::
           set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::find((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)in_stack_fffffffffffffc78._M_current,
                  (key_type *)in_stack_fffffffffffffc70._M_current);
      local_118._M_node =
           (_Base_ptr)
           CLI::std::
           set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::end((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)in_stack_fffffffffffffc68);
      bVar3 = CLI::std::operator==(&local_110,&local_118);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
        operator[](in_RDI,local_108);
        pVar8 = CLI::std::
                set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::insert((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)in_stack_fffffffffffffc90,
                         (value_type *)in_stack_fffffffffffffc88._M_current);
        local_128 = (_Base_ptr)pVar8.first._M_node;
        local_120 = pVar8.second;
        CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
        operator[](in_RDI,local_108);
        pVar9 = CLI::std::
                unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
                ::equal_range((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
                               *)in_stack_fffffffffffffc70._M_current,
                              &in_stack_fffffffffffffc68->interface1);
        local_138 = pVar9;
        std::
        tie<std::__detail::_Node_const_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>,false,true>,std::__detail::_Node_const_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>,false,true>>
                  ((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>
                    *)in_stack_fffffffffffffc78._M_current,
                   (_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>
                    *)in_stack_fffffffffffffc70._M_current);
        std::
        tuple<std::__detail::_Node_const_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>,false,true>&,std::__detail::_Node_const_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::Connection>,false,true>&>
        ::operator=((tuple<std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>_&,_std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>_&>
                     *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                    (pair<std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>_>
                     *)in_stack_fffffffffffffc78._M_current);
        p_Var2 = local_58;
        local_158._M_string_length =
             (size_type)
             CLI::std::
             unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
             ::end((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>_>_>
                    *)in_stack_fffffffffffffc68);
        bVar3 = CLI::std::__detail::operator==
                          (p_Var2,(_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                                   *)&local_158._M_string_length);
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          local_158._M_dataplus._M_p = (pointer)local_58->_M_cur;
          while( true ) {
            bVar3 = CLI::std::__detail::operator==
                              ((_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_true>
                                *)&local_158,local_60);
            if (((bVar3 ^ 0xffU) & 1) == 0) break;
            CLI::std::__detail::
            _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>
            ::operator->((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>
                          *)0x1f077f);
            bVar3 = CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
            local_351 = 1;
            if (!bVar3) {
              local_168 = (unsigned_long *)
                          CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_fffffffffffffc68);
              local_170 = (unsigned_long *)
                          CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_fffffffffffffc68);
              in_stack_fffffffffffffc98 = &local_158;
              CLI::std::__detail::
              _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>
              ::operator->((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>
                            *)0x1f07dc);
              local_178 = (unsigned_long *)
                          CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_fffffffffffffc68);
              CLI::std::__detail::
              _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>
              ::operator->((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>
                            *)0x1f07fa);
              local_180 = (unsigned_long *)
                          CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_fffffffffffffc68);
              __last1_00._M_current._7_1_ = in_stack_fffffffffffffc87;
              __last1_00._M_current._0_7_ = in_stack_fffffffffffffc80;
              in_stack_fffffffffffffca0 =
                   std::
                   find_first_of<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                             (in_stack_fffffffffffffc88,__last1_00,in_stack_fffffffffffffc78,
                              in_stack_fffffffffffffc70._M_current);
              local_160 = in_stack_fffffffffffffca0._M_current;
              local_188 = (unsigned_long *)
                          CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     in_stack_fffffffffffffc68);
              bVar3 = __gnu_cxx::
                      operator==<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)in_stack_fffffffffffffc70._M_current,
                                 (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)in_stack_fffffffffffffc68);
              local_351 = bVar3 ^ 0xff;
            }
            if ((local_351 & 1) != 0) {
              CLI::std::__detail::
              _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>
              ::operator->((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>
                            *)0x1f0891);
              std::vector<helics::apps::Connection,std::allocator<helics::apps::Connection>>::
              emplace_back<helics::apps::Connection_const&>
                        ((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                          *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                         (Connection *)in_stack_fffffffffffffc78._M_current);
              pvVar6 = CLI::std::
                       vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
                       back((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                             *)in_stack_fffffffffffffc70._M_current);
              local_198 = (pvVar6->interface1)._M_len;
              local_190 = (pvVar6->interface1)._M_str;
              pvVar6 = CLI::std::
                       vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
                       operator[](in_RDI,local_108);
              local_1a8 = (pvVar6->interface2)._M_len;
              local_1a0 = (pvVar6->interface2)._M_str;
              __x_00._M_str = (char *)in_stack_fffffffffffffca0._M_current;
              __x_00._M_len = (size_t)in_stack_fffffffffffffc98;
              __y_00._M_str = (char *)in_stack_fffffffffffffc90;
              __y_00._M_len = (size_t)in_stack_fffffffffffffc88._M_current;
              bVar3 = std::operator==(__x_00,__y_00);
              if (((bVar3 ^ 0xffU) & 1) != 0) {
                in_stack_fffffffffffffc90 =
                     CLI::std::
                     vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
                     back((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                           *)in_stack_fffffffffffffc70._M_current);
                pvVar6 = CLI::std::
                         vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                         ::back((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                                 *)in_stack_fffffffffffffc70._M_current);
                std::swap<std::basic_string_view<char,std::char_traits<char>>>
                          (&in_stack_fffffffffffffc90->interface1,&pvVar6->interface2);
              }
              CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
              ::back((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *)
                     in_stack_fffffffffffffc70._M_current);
              in_stack_fffffffffffffc88._M_current =
                   (unsigned_long *)
                   CLI::std::
                   set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::find(in_stack_fffffffffffffc78._M_current,in_stack_fffffffffffffc70._M_current)
              ;
              local_1b0._M_node = (_Base_ptr)in_stack_fffffffffffffc88._M_current;
              local_1b8._M_node =
                   (_Base_ptr)
                   CLI::std::
                   set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::end((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)in_stack_fffffffffffffc68);
              bVar3 = CLI::std::operator==(&local_1b0,&local_1b8);
              if (((bVar3 ^ 0xffU) & 1) != 0) {
                CLI::std::
                vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
                pop_back((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                          *)0x1f09c9);
              }
            }
            CLI::std::__detail::
            _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>
            ::operator++((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::Connection>,_false,_true>
                          *)in_stack_fffffffffffffc70._M_current);
          }
        }
        local_108 = local_108 + 1;
      }
      else {
        local_108 = local_108 + 1;
      }
    }
    CLI::std::
    set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~set((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)0x1f0a07);
  }
  bVar3 = CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
          empty((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *)
                CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
  if ((bVar3) || ((*(byte *)(in_RSI + 0x1ba) & 1) != 0)) {
    bVar3 = CLI::std::
            vector<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
            ::empty((vector<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
                     *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
    if (!bVar3) {
      local_1c0 = in_RSI + 0x120;
      local_1c8._M_current =
           (shared_ptr<helics::apps::RegexMatcher> *)
           CLI::std::
           vector<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
           ::begin((vector<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
                    *)in_stack_fffffffffffffc68);
      CLI::std::
      vector<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
      ::end((vector<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>
             *)in_stack_fffffffffffffc68);
      while( true ) {
        bVar3 = __gnu_cxx::
                operator==<const_std::shared_ptr<helics::apps::RegexMatcher>_*,_std::vector<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>_>
                          ((__normal_iterator<const_std::shared_ptr<helics::apps::RegexMatcher>_*,_std::vector<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>_>
                            *)in_stack_fffffffffffffc70._M_current,
                           (__normal_iterator<const_std::shared_ptr<helics::apps::RegexMatcher>_*,_std::vector<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>_>
                            *)in_stack_fffffffffffffc68);
        if (((bVar3 ^ 0xffU) & 1) == 0) break;
        __gnu_cxx::
        __normal_iterator<const_std::shared_ptr<helics::apps::RegexMatcher>_*,_std::vector<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>_>
        ::operator*(&local_1c8);
        CLI::std::
        __shared_ptr_access<helics::apps::RegexMatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<helics::apps::RegexMatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1f0acb);
        bVar3 = CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80));
        in_stack_fffffffffffffc87 = 1;
        if (!bVar3) {
          CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffc68);
          CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffc68);
          CLI::std::
          __shared_ptr_access<helics::apps::RegexMatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<helics::apps::RegexMatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1f0b1f);
          CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffc68);
          CLI::std::
          __shared_ptr_access<helics::apps::RegexMatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<helics::apps::RegexMatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1f0b40);
          CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffc68);
          __last1_01._M_current._7_1_ = in_stack_fffffffffffffc87;
          __last1_01._M_current._0_7_ = in_stack_fffffffffffffc80;
          in_stack_fffffffffffffc78 =
               std::
               find_first_of<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                         (in_stack_fffffffffffffc88,__last1_01,in_stack_fffffffffffffc78._M_current,
                          in_stack_fffffffffffffc70);
          CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffc68);
          bVar3 = __gnu_cxx::
                  operator==<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)in_stack_fffffffffffffc70._M_current,
                             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)in_stack_fffffffffffffc68);
          in_stack_fffffffffffffc87 = bVar3 ^ 0xff;
        }
        if ((in_stack_fffffffffffffc87 & 1) != 0) {
          CLI::std::
          __shared_ptr_access<helics::apps::RegexMatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<helics::apps::RegexMatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1f0bd7);
          testString._M_str = in_stack_fffffffffffffd78;
          testString._M_len = (size_t)in_stack_fffffffffffffd70;
          RegexMatcher::generateMatch_abi_cxx11_(in_stack_fffffffffffffd68,testString);
          bVar3 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x1f0c16);
          if (!bVar3) {
            Connection::Connection((Connection *)in_stack_fffffffffffffc70._M_current);
            std::make_shared<std::__cxx11::string,std::__cxx11::string&>(in_stack_fffffffffffffc98);
            in_stack_fffffffffffffc70._M_current = (unsigned_long *)&stack0xfffffffffffffd68;
            CLI::std::
            shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator=((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_fffffffffffffc70._M_current,
                        (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_fffffffffffffc68);
            std::
            shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x1f0c66);
            peVar7 = CLI::std::
                     __shared_ptr_access<helics::apps::RegexMatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<helics::apps::RegexMatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1f0c73);
            in_stack_fffffffffffffd78 = (char *)(peVar7->interface1)._M_len;
            CLI::std::
            __shared_ptr_access<helics::apps::RegexMatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<helics::apps::RegexMatcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1f0c8c);
            CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                      (in_stack_fffffffffffffd10,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08));
            CLI::std::
            __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)in_stack_fffffffffffffc70._M_current);
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffc70._M_current);
            CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
            push_back((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *
                      )in_stack_fffffffffffffc70._M_current,in_stack_fffffffffffffc68);
            Connection::~Connection((Connection *)in_stack_fffffffffffffc70._M_current);
          }
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc70._M_current);
        }
        __gnu_cxx::
        __normal_iterator<const_std::shared_ptr<helics::apps::RegexMatcher>_*,_std::vector<std::shared_ptr<helics::apps::RegexMatcher>,_std::allocator<std::shared_ptr<helics::apps::RegexMatcher>_>_>_>
        ::operator++(&local_1c8);
      }
    }
  }
  return in_RDI;
}

Assistant:

std::vector<Connection>
    Connector::buildPossibleConnectionList(std::string_view startingInterface,
                                           const std::vector<std::size_t>& tagList) const
{
    std::vector<Connection> matches;
    auto [first, last] = connections.equal_range(startingInterface);
    if (first != connections.end()) {
        std::set<std::string_view> searched;
        searched.insert(startingInterface);

        for (auto match = first; match != last; ++match) {
            if (match->second.tags.empty() ||
                std::find_first_of(tagList.begin(),
                                   tagList.end(),
                                   match->second.tags.begin(),
                                   match->second.tags.end()) != tagList.end()) {
                matches.emplace_back(match->second);
                if (matches.back().interface1 != startingInterface) {
                    std::swap(matches.back().interface1, matches.back().interface2);
                }
            }
        }
        std::size_t cascadeIndex{0};
        while (cascadeIndex < matches.size()) {
            if (searched.find(matches[cascadeIndex].interface2) != searched.end()) {
                ++cascadeIndex;
                continue;
            }
            searched.insert(matches[cascadeIndex].interface2);
            std::tie(first, last) = connections.equal_range(matches[cascadeIndex].interface2);
            if (first != connections.end()) {
                for (auto match = first; match != last; ++match) {
                    if (match->second.tags.empty() ||
                        std::find_first_of(tagList.begin(),
                                           tagList.end(),
                                           match->second.tags.begin(),
                                           match->second.tags.end()) != tagList.end()) {
                        matches.emplace_back(match->second);
                        if (matches.back().interface1 != matches[cascadeIndex].interface2) {
                            std::swap(matches.back().interface1, matches.back().interface2);
                        }
                        if (searched.find(matches.back().interface2) != searched.end()) {
                            // this would already be references and create a cyclic reference
                            matches.pop_back();
                        }
                    }
                }
            }
            ++cascadeIndex;
        }
    }
    if (matches.empty() || alwaysCheckRegex) {
        if (!regexMatchers.empty()) {
            for (const auto& rmatcher : regexMatchers) {
                if (rmatcher->tags.empty() ||
                    std::find_first_of(tagList.begin(),
                                       tagList.end(),
                                       rmatcher->tags.begin(),
                                       rmatcher->tags.end()) != tagList.end()) {
                    auto mstring = rmatcher->generateMatch(startingInterface);
                    if (!mstring.empty()) {
                        Connection connection;
                        connection.stringBuffer = std::make_shared<std::string>(mstring);
                        connection.interface1 = rmatcher->interface1;
                        connection.tags = rmatcher->tags;
                        connection.interface2 = *connection.stringBuffer;
                        connection.direction = InterfaceDirection::FROM_TO;
                        matches.push_back(std::move(connection));
                    }
                }
            }
        }
    }
    return matches;
}